

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

int __thiscall
re2::Compiler::UncachedRuneByteSuffix(Compiler *this,uint8 lo,uint8 hi,bool foldcase,int next)

{
  PatchList PVar1;
  Frag FVar2;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  
  FVar2 = ByteRange(this,(int)CONCAT71(in_register_00000031,lo),
                    (int)CONCAT71(in_register_00000011,hi),foldcase);
  if (next == 0) {
    PVar1 = PatchList::Append(this->inst_,(this->rune_range_).end.p,FVar2.end.p);
    (this->rune_range_).end.p = PVar1.p;
  }
  else {
    PatchList::Patch(this->inst_,FVar2.end.p,next);
  }
  return FVar2.begin;
}

Assistant:

int Compiler::UncachedRuneByteSuffix(uint8 lo, uint8 hi, bool foldcase,
                                     int next) {
  Frag f = ByteRange(lo, hi, foldcase);
  if (next != 0) {
    PatchList::Patch(inst_, f.end, next);
  } else {
    rune_range_.end = PatchList::Append(inst_, rune_range_.end, f.end);
  }
  return f.begin;
}